

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

void __thiscall Snes_Spc::set_output(Snes_Spc *this,sample_t_conflict1 *out,int size)

{
  int in_EDX;
  sample_t_conflict1 *in_RSI;
  Snes_Spc *in_RDI;
  sample_t_conflict1 *in;
  sample_t_conflict1 *out_end;
  sample_t_conflict1 *local_28;
  sample_t_conflict1 *local_20;
  sample_t_conflict1 *local_10;
  
  (in_RDI->m).extra_clocks = (in_RDI->m).extra_clocks & 0x1f;
  if (in_RSI == (sample_t_conflict1 *)0x0) {
    reset_buf(in_RDI);
  }
  else {
    local_20 = in_RSI + in_EDX;
    (in_RDI->m).buf_begin = in_RSI;
    (in_RDI->m).buf_end = local_20;
    local_28 = (in_RDI->m).extra_buf;
    local_10 = in_RSI;
    while (local_28 < (in_RDI->m).extra_pos && local_10 < local_20) {
      *local_10 = *local_28;
      local_28 = local_28 + 1;
      local_10 = local_10 + 1;
    }
    if (local_20 <= local_10) {
      local_10 = Spc_Dsp::extra(&in_RDI->dsp);
      local_20 = Spc_Dsp::extra(&in_RDI->dsp);
      local_20 = local_20 + 0x10;
      while (local_28 < (in_RDI->m).extra_pos) {
        *local_10 = *local_28;
        local_28 = local_28 + 1;
        local_10 = local_10 + 1;
      }
    }
    Spc_Dsp::set_output(&in_RDI->dsp,local_10,(int)((long)local_20 - (long)local_10 >> 1));
  }
  return;
}

Assistant:

void Snes_Spc::set_output( sample_t* out, int size )
{
	require( (size & 1) == 0 ); // size must be even
	
	m.extra_clocks &= clocks_per_sample - 1;
	if ( out )
	{
		sample_t const* out_end = out + size;
		m.buf_begin = out;
		m.buf_end   = out_end;
		
		// Copy extra to output
		sample_t const* in = m.extra_buf;
		while ( in < m.extra_pos && out < out_end )
			*out++ = *in++;
		
		// Handle output being full already
		if ( out >= out_end )
		{
			// Have DSP write to remaining extra space
			out     = dsp.extra();
			out_end = &dsp.extra() [extra_size];
			
			// Copy any remaining extra samples as if DSP wrote them
			while ( in < m.extra_pos )
				*out++ = *in++;
			assert( out <= out_end );
		}
		
		dsp.set_output( out, int(out_end - out) );
	}
	else
	{
		reset_buf();
	}
}